

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

int __thiscall QFramePrivate::init(QFramePrivate *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  QFrame *q;
  SubElement in_stack_00000014;
  QWidgetPrivate *in_stack_00000018;
  bool in_stack_00000053;
  WidgetAttribute in_stack_00000054;
  QWidget *in_stack_00000058;
  
  q_func(this);
  QWidgetPrivate::setLayoutItemMargins(in_stack_00000018,in_stack_00000014,(QStyleOption *)q);
  QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
  return extraout_EAX;
}

Assistant:

inline void QFramePrivate::init()
{
    Q_Q(QFrame);
    setLayoutItemMargins(QStyle::SE_FrameLayoutItem);

    // The frameRect property is implemented in terms of the widget's
    // contentsRect, which conflicts with the implicit inclusion of
    // the safe area margins in the contentsRect.
    q->setAttribute(Qt::WA_ContentsMarginsRespectsSafeArea, false);
}